

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

bool __thiscall
glslang::HlslParseContext::setTextureReturnType
          (HlslParseContext *this,TSampler *sampler,TType *retType,TSourceLoc *loc)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  size_type sVar6;
  reference pvVar7;
  reference ppTVar8;
  uint local_48;
  uint idx;
  uint memberVectorSize;
  uint m;
  uint totalComponents;
  TTypeList *members;
  TSourceLoc *loc_local;
  TType *retType_local;
  TSampler *sampler_local;
  HlslParseContext *this_local;
  
  *sampler = (TSampler)((uint)*sampler & 0xe1ffffff | 0x1e000000);
  members = (TTypeList *)loc;
  loc_local = (TSourceLoc *)retType;
  retType_local = (TType *)sampler;
  sampler_local = (TSampler *)this;
  uVar2 = (*retType->_vptr_TType[0x1d])();
  if ((uVar2 & 1) != 0) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,members,"Arrays not supported in texture template types","");
    return false;
  }
  uVar5 = (*(code *)loc_local->name[5]._M_string_length)();
  if (((uVar5 & 1) != 0) ||
     (uVar5 = (**(code **)((long)&loc_local->name[4].field_2 + 8))(), (uVar5 & 1) != 0)) {
    uVar2 = (*(code *)loc_local->name[2]._M_string_length)();
    *(uint *)&retType_local->_vptr_TType =
         *(uint *)&retType_local->_vptr_TType & 0xfe3fffff | (uVar2 & 7) << 0x16;
    return true;
  }
  uVar5 = (*(code *)loc_local->name[7]._M_string_length)();
  if ((uVar5 & 1) == 0) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,members,"Invalid texture template type","");
    return false;
  }
  bVar1 = TSampler::isSubpass((TSampler *)retType_local);
  if (!bVar1) {
    _m = &TType::getWritableStruct((TType *)loc_local)->
          super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
    sVar6 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::size(_m);
    if ((sVar6 < 5) &&
       (sVar6 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::size
                          (_m), sVar6 != 0)) {
      memberVectorSize = 0;
      idx = 0;
      while( true ) {
        sVar6 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::size
                          (_m);
        if (sVar6 <= idx) {
          local_48 = 0;
          while( true ) {
            sVar6 = std::
                    vector<glslang::TVector<glslang::TTypeLoc>_*,_glslang::pool_allocator<glslang::TVector<glslang::TTypeLoc>_*>_>
                    ::size(&(this->textureReturnStruct).
                            super_vector<glslang::TVector<glslang::TTypeLoc>_*,_glslang::pool_allocator<glslang::TVector<glslang::TTypeLoc>_*>_>
                          );
            if (sVar6 <= local_48) {
              sVar6 = std::
                      vector<glslang::TVector<glslang::TTypeLoc>_*,_glslang::pool_allocator<glslang::TVector<glslang::TTypeLoc>_*>_>
                      ::size(&(this->textureReturnStruct).
                              super_vector<glslang::TVector<glslang::TTypeLoc>_*,_glslang::pool_allocator<glslang::TVector<glslang::TTypeLoc>_*>_>
                            );
              if (0xe < sVar6) {
                (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                          (this,members,"Texture template struct return slots exceeded","");
                return false;
              }
              sVar6 = std::
                      vector<glslang::TVector<glslang::TTypeLoc>_*,_glslang::pool_allocator<glslang::TVector<glslang::TTypeLoc>_*>_>
                      ::size(&(this->textureReturnStruct).
                              super_vector<glslang::TVector<glslang::TTypeLoc>_*,_glslang::pool_allocator<glslang::TVector<glslang::TTypeLoc>_*>_>
                            );
              *(uint *)&retType_local->_vptr_TType =
                   *(uint *)&retType_local->_vptr_TType & 0xe1ffffff | ((uint)sVar6 & 0xf) << 0x19;
              std::
              vector<glslang::TVector<glslang::TTypeLoc>_*,_glslang::pool_allocator<glslang::TVector<glslang::TTypeLoc>_*>_>
              ::push_back(&(this->textureReturnStruct).
                           super_vector<glslang::TVector<glslang::TTypeLoc>_*,_glslang::pool_allocator<glslang::TVector<glslang::TTypeLoc>_*>_>
                          ,(value_type *)&m);
              return true;
            }
            ppTVar8 = std::
                      vector<glslang::TVector<glslang::TTypeLoc>_*,_glslang::pool_allocator<glslang::TVector<glslang::TTypeLoc>_*>_>
                      ::operator[](&(this->textureReturnStruct).
                                    super_vector<glslang::TVector<glslang::TTypeLoc>_*,_glslang::pool_allocator<glslang::TVector<glslang::TTypeLoc>_*>_>
                                   ,(ulong)local_48);
            if (&(*ppTVar8)->
                 super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> == _m)
            break;
            local_48 = local_48 + 1;
          }
          *(uint *)&retType_local->_vptr_TType =
               *(uint *)&retType_local->_vptr_TType & 0xe1ffffff | (local_48 & 0xf) << 0x19;
          return true;
        }
        pvVar7 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                 operator[](_m,(ulong)idx);
        uVar2 = (*pvVar7->type->_vptr_TType[0x18])();
        if ((uVar2 & 1) == 0) {
          pvVar7 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                   operator[](_m,(ulong)idx);
          uVar2 = (*pvVar7->type->_vptr_TType[0x1b])();
          if ((uVar2 & 1) == 0) {
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,members,"Invalid texture template struct member type","");
            return false;
          }
        }
        pvVar7 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                 operator[](_m,(ulong)idx);
        iVar3 = (*pvVar7->type->_vptr_TType[0xc])();
        memberVectorSize = iVar3 + memberVectorSize;
        if (4 < memberVectorSize) break;
        pvVar7 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                 operator[](_m,(ulong)idx);
        iVar3 = (*pvVar7->type->_vptr_TType[7])();
        pvVar7 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                 operator[](_m,0);
        iVar4 = (*pvVar7->type->_vptr_TType[7])();
        if (iVar3 != iVar4) {
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,members,"Texture template structure members must same basic type","");
          return false;
        }
        idx = idx + 1;
      }
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,members,"Too many components in texture template structure type","");
      return false;
    }
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,members,"Invalid member count in texture template structure","");
    return false;
  }
  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
            (this,members,"Unimplemented: structure template type in subpass input","");
  return false;
}

Assistant:

bool HlslParseContext::setTextureReturnType(TSampler& sampler, const TType& retType, const TSourceLoc& loc)
{
    // Seed the output with an invalid index.  We will set it to a valid one if we can.
    sampler.structReturnIndex = TSampler::noReturnStruct;

    // Arrays aren't supported.
    if (retType.isArray()) {
        error(loc, "Arrays not supported in texture template types", "", "");
        return false;
    }

    // If return type is a vector, remember the vector size in the sampler, and return.
    if (retType.isVector() || retType.isScalar()) {
        sampler.vectorSize = retType.getVectorSize();
        return true;
    }

    // If it wasn't a vector, it must be a struct meeting certain requirements.  The requirements
    // are checked below: just check for struct-ness here.
    if (!retType.isStruct()) {
        error(loc, "Invalid texture template type", "", "");
        return false;
    }

    // TODO: Subpass doesn't handle struct returns, due to some oddities with fn overloading.
    if (sampler.isSubpass()) {
        error(loc, "Unimplemented: structure template type in subpass input", "", "");
        return false;
    }

    TTypeList* members = retType.getWritableStruct();

    // Check for too many or not enough structure members.
    if (members->size() > 4 || members->size() == 0) {
        error(loc, "Invalid member count in texture template structure", "", "");
        return false;
    }

    // Error checking: We must have <= 4 total components, all of the same basic type.
    unsigned totalComponents = 0;
    for (unsigned m = 0; m < members->size(); ++m) {
        // Check for bad member types
        if (!(*members)[m].type->isScalar() && !(*members)[m].type->isVector()) {
            error(loc, "Invalid texture template struct member type", "", "");
            return false;
        }

        const unsigned memberVectorSize = (*members)[m].type->getVectorSize();
        totalComponents += memberVectorSize;

        // too many total member components
        if (totalComponents > 4) {
            error(loc, "Too many components in texture template structure type", "", "");
            return false;
        }

        // All members must be of a common basic type
        if ((*members)[m].type->getBasicType() != (*members)[0].type->getBasicType()) {
            error(loc, "Texture template structure members must same basic type", "", "");
            return false;
        }
    }

    // If the structure in the return type already exists in the table, we'll use it.  Otherwise, we'll make
    // a new entry.  This is a linear search, but it hardly ever happens, and the list cannot be very large.
    for (unsigned int idx = 0; idx < textureReturnStruct.size(); ++idx) {
        if (textureReturnStruct[idx] == members) {
            sampler.structReturnIndex = idx;
            return true;
        }
    }

    // It wasn't found as an existing entry.  See if we have room for a new one.
    if (textureReturnStruct.size() >= TSampler::structReturnSlots) {
        error(loc, "Texture template struct return slots exceeded", "", "");
        return false;
    }

    // Insert it in the vector that tracks struct return types.
    sampler.structReturnIndex = unsigned(textureReturnStruct.size());
    textureReturnStruct.push_back(members);

    // Success!
    return true;
}